

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncapsulatedFileManager.cpp
# Opt level: O3

int __thiscall
supermap::io::EncapsulatedFileManager::rename(EncapsulatedFileManager *this,char *__old,char *__new)

{
  FileManager *pFVar1;
  int extraout_EAX;
  path pStack_68;
  path local_40;
  
  pFVar1 = (this->innerManager_)._M_t.
           super___uniq_ptr_impl<supermap::io::FileManager,_std::default_delete<supermap::io::FileManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::io::FileManager_*,_std::default_delete<supermap::io::FileManager>_>
           .super__Head_base<0UL,_supermap::io::FileManager_*,_false>._M_head_impl;
  makeRootPath(&local_40,this,(path *)__old);
  makeRootPath(&pStack_68,this,(path *)__new);
  (*pFVar1->_vptr_FileManager[3])(pFVar1,&local_40,&pStack_68);
  std::filesystem::__cxx11::path::~path(&pStack_68);
  std::filesystem::__cxx11::path::~path(&local_40);
  return extraout_EAX;
}

Assistant:

void EncapsulatedFileManager::rename(const std::filesystem::path &prevPath, const std::filesystem::path &nextPath) {
    innerManager_->rename(makeRootPath(prevPath), makeRootPath(nextPath));
}